

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::QuadMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
::build(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
       BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::QuadMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
       *this,BuildPrim *src,BuildPrim *tmp,size_t numPrimitives)

{
  CachedAllocator alloc;
  range<unsigned_int> local_20;
  
  this->morton = src;
  radix_sort<embree::sse2::BVHBuilderMorton::BuildPrim,unsigned_int>
            (src,tmp,numPrimitives,(this->super_Settings).singleThreadThreshold);
  local_20._begin = 0;
  local_20._end = (uint)numPrimitives;
  alloc.talloc1 = (ThreadLocal *)0x0;
  alloc.alloc = (FastAllocator *)0x0;
  alloc.talloc0 = (ThreadLocal *)0x0;
  recurse(__return_storage_ptr__,this,1,&local_20,alloc,true);
  return __return_storage_ptr__;
}

Assistant:

ReductionTy build(BuildPrim* src, BuildPrim* tmp, size_t numPrimitives)
        {
          /* sort morton codes */
          morton = src;
          radix_sort_u32(src,tmp,numPrimitives,singleThreadThreshold);

          /* build BVH */
          const ReductionTy root = recurse(1, range<unsigned>(0,(unsigned)numPrimitives), nullptr, true);
          _mm_mfence(); // to allow non-temporal stores during build
          return root;
        }